

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<SynBase_*,_false,_false>::grow_and_add
          (FastVector<SynBase_*,_false,_false> *this,uint newSize,SynBase **val)

{
  uint uVar1;
  uint uVar2;
  SynBase **ptr;
  SynBase *pSVar3;
  uint oldMax;
  SynBase **oldData;
  SynBase **val_local;
  uint newSize_local;
  FastVector<SynBase_*,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pSVar3 = *val;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  this->data[uVar2] = pSVar3;
  if (ptr != (SynBase **)0x0) {
    NULLC::destruct<SynBase*>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}